

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O2

pair<phmap::priv::raw_hash_set<phmap::priv::FlatHashSetPolicy<int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<int>_>::iterator,_bool>
* __thiscall
phmap::priv::
raw_hash_set<phmap::priv::FlatHashSetPolicy<int>,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<int>>
::emplace_decomposable<int,int_const>
          (pair<phmap::priv::raw_hash_set<phmap::priv::FlatHashSetPolicy<int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<int>_>::iterator,_bool>
           *__return_storage_ptr__,void *this,int *key,size_t hashval,int *args)

{
  long lVar1;
  size_t i;
  ctrl_t *pcVar2;
  bool bVar3;
  
  i = raw_hash_set<phmap::priv::FlatHashSetPolicy<int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<int>_>
      ::_find_key<int>((raw_hash_set<phmap::priv::FlatHashSetPolicy<int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<int>_>
                        *)this,key,hashval);
  bVar3 = i == 0xffffffffffffffff;
  if (bVar3) {
    i = raw_hash_set<phmap::priv::FlatHashSetPolicy<int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<int>_>
        ::prepare_insert((raw_hash_set<phmap::priv::FlatHashSetPolicy<int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<int>_>
                          *)this,hashval);
    *(int *)(*(long *)((long)this + 8) + i * 4) = *args;
    raw_hash_set<phmap::priv::FlatHashSetPolicy<int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<int>_>
    ::set_ctrl((raw_hash_set<phmap::priv::FlatHashSetPolicy<int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<int>_>
                *)this,i,(byte)hashval & 0x7f);
    pcVar2 = (ctrl_t *)(i + *this);
  }
  else {
    pcVar2 = (ctrl_t *)(*this + i);
  }
  lVar1 = *(long *)((long)this + 8);
  (__return_storage_ptr__->first).ctrl_ = pcVar2;
  (__return_storage_ptr__->first).field_1.slot_ = (slot_type *)(i * 4 + lVar1);
  __return_storage_ptr__->second = bVar3;
  return __return_storage_ptr__;
}

Assistant:

std::pair<iterator, bool> emplace_decomposable(const K& key, size_t hashval, 
                                                   Args&&... args)
    {
        size_t offset = _find_key(key, hashval);
        if (offset == (size_t)-1) {
            offset = prepare_insert(hashval);
            emplace_at(offset, std::forward<Args>(args)...);
            this->set_ctrl(offset, H2(hashval));
            return {iterator_at(offset), true};
        }
        return {iterator_at(offset), false};
    }